

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armor.cpp
# Opt level: O0

void wear(void)

{
  ItemThing *obj_00;
  char *pcVar1;
  char *sp;
  ItemThing *obj;
  
  obj_00 = get_item("wear",3);
  if (obj_00 != (ItemThing *)0x0) {
    if (cur_armor == (ItemThing *)0x0) {
      if (obj_00->type == 3) {
        waste_time();
        obj_00->flags = obj_00->flags | 2;
        pcVar1 = inv_name(obj_00,true);
        cur_armor = obj_00;
        if ((terse & 1U) == 0) {
          addmsg("you are now ");
        }
        msg("wearing %s",pcVar1);
      }
      else {
        msg("you can\'t wear that");
      }
    }
    else {
      addmsg("you are already wearing some");
      if ((terse & 1U) == 0) {
        addmsg(".  You\'ll have to take it off first");
      }
      endmsg();
      after = false;
    }
  }
  return;
}

Assistant:

void wear()
{
    ItemThing *obj;
    const char *sp;

    if ((obj = get_item("wear", ARMOR)) == nullptr)
        return;
    if (cur_armor != nullptr)
    {
        addmsg("you are already wearing some");
        if (!terse)
            addmsg(".  You'll have to take it off first");
        endmsg();
        after = false;
        return;
    }
    if (obj->type != ARMOR)
    {
        msg("you can't wear that");
        return;
    }
    waste_time();
    obj->flags |= ISKNOW;
    sp = inv_name(obj, true);
    cur_armor = obj;
    if (!terse)
        addmsg("you are now ");
    msg("wearing %s", sp);
}